

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumDefinition
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  string *output;
  undefined8 *puVar3;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar2 = Consume(this,"enum");
  if (bVar2) {
    LocationRecorder::LocationRecorder(&LStack_48,enum_location,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&enum_type->super_Message,NAME);
    *(byte *)(enum_type->_has_bits_).has_bits_ = (byte)(enum_type->_has_bits_).has_bits_[0] | 1;
    uVar1 = (enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    output = internal::ArenaStringPtr::Mutable_abi_cxx11_(&enum_type->name_,puVar3);
    bVar2 = ConsumeIdentifier(this,output,"Expected enum name.");
    LocationRecorder::~LocationRecorder(&LStack_48);
    if ((bVar2) && (bVar2 = ParseEnumBlock(this,enum_type,enum_location,containing_file), bVar2)) {
      bVar2 = ValidateEnum(this,enum_type);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumDefinition(EnumDescriptorProto* enum_type,
                                 const LocationRecorder& enum_location,
                                 const FileDescriptorProto* containing_file) {
  DO(Consume("enum"));

  {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_type,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_type->mutable_name(), "Expected enum name."));
  }

  DO(ParseEnumBlock(enum_type, enum_location, containing_file));

  DO(ValidateEnum(enum_type));

  return true;
}